

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

NFSubstitution * __thiscall
icu_63::NFRule::extractSubstitution
          (NFRule *this,NFRuleSet *ruleSet,NFRule *predecessor,UErrorCode *status)

{
  char16_t cVar1;
  int32_t offset;
  int32_t iVar2;
  undefined1 local_88 [8];
  UnicodeString subToken;
  int local_40;
  UChar c;
  int32_t subEnd;
  int32_t subStart;
  NFSubstitution *result;
  UErrorCode *status_local;
  NFRule *predecessor_local;
  NFRuleSet *ruleSet_local;
  NFRule *this_local;
  
  offset = indexOfAnyRulePrefix(this);
  if (offset == -1) {
    this_local = (NFRule *)0x0;
  }
  else {
    iVar2 = icu_63::UnicodeString::indexOf(&this->fRuleText,L">>>",3,0);
    if (iVar2 == offset) {
      local_40 = offset + 2;
    }
    else {
      subToken.fUnion.fStackFields.fBuffer[0x1a] =
           icu_63::UnicodeString::charAt(&this->fRuleText,offset);
      local_40 = icu_63::UnicodeString::indexOf
                           (&this->fRuleText,subToken.fUnion.fStackFields.fBuffer[0x1a],offset + 1);
      if ((((subToken.fUnion.fStackFields.fBuffer[0x1a] == L'<') && (local_40 != -1)) &&
          (iVar2 = icu_63::UnicodeString::length(&this->fRuleText), local_40 < iVar2 + -1)) &&
         (cVar1 = icu_63::UnicodeString::charAt(&this->fRuleText,local_40 + 1),
         cVar1 == subToken.fUnion.fStackFields.fBuffer[0x1a])) {
        local_40 = local_40 + 1;
      }
    }
    if (local_40 == -1) {
      this_local = (NFRule *)0x0;
    }
    else {
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_88);
      icu_63::UnicodeString::setTo
                ((UnicodeString *)local_88,&this->fRuleText,offset,(local_40 - offset) + 1);
      this_local = (NFRule *)
                   NFSubstitution::makeSubstitution
                             (offset,this,predecessor,ruleSet,this->formatter,
                              (UnicodeString *)local_88,status);
      icu_63::UnicodeString::removeBetween(&this->fRuleText,offset,local_40 + 1);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_88);
    }
  }
  return (NFSubstitution *)this_local;
}

Assistant:

NFSubstitution *
NFRule::extractSubstitution(const NFRuleSet* ruleSet,
                            const NFRule* predecessor,
                            UErrorCode& status)
{
    NFSubstitution* result = NULL;

    // search the rule's rule text for the first two characters of
    // a substitution token
    int32_t subStart = indexOfAnyRulePrefix();
    int32_t subEnd = subStart;

    // if we didn't find one, create a null substitution positioned
    // at the end of the rule text
    if (subStart == -1) {
        return NULL;
    }

    // special-case the ">>>" token, since searching for the > at the
    // end will actually find the > in the middle
    if (fRuleText.indexOf(gGreaterGreaterGreater, 3, 0) == subStart) {
        subEnd = subStart + 2;

        // otherwise the substitution token ends with the same character
        // it began with
    } else {
        UChar c = fRuleText.charAt(subStart);
        subEnd = fRuleText.indexOf(c, subStart + 1);
        // special case for '<%foo<<'
        if (c == gLessThan && subEnd != -1 && subEnd < fRuleText.length() - 1 && fRuleText.charAt(subEnd+1) == c) {
            // ordinals use "=#,##0==%abbrev=" as their rule.  Notice that the '==' in the middle
            // occurs because of the juxtaposition of two different rules.  The check for '<' is a hack
            // to get around this.  Having the duplicate at the front would cause problems with
            // rules like "<<%" to format, say, percents...
            ++subEnd;
        }
   }

    // if we don't find the end of the token (i.e., if we're on a single,
    // unmatched token character), create a null substitution positioned
    // at the end of the rule
    if (subEnd == -1) {
        return NULL;
    }

    // if we get here, we have a real substitution token (or at least
    // some text bounded by substitution token characters).  Use
    // makeSubstitution() to create the right kind of substitution
    UnicodeString subToken;
    subToken.setTo(fRuleText, subStart, subEnd + 1 - subStart);
    result = NFSubstitution::makeSubstitution(subStart, this, predecessor, ruleSet,
        this->formatter, subToken, status);

    // remove the substitution from the rule text
    fRuleText.removeBetween(subStart, subEnd+1);

    return result;
}